

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O1

int Map_LibraryRead(Map_SuperLib_t *pLib,char *pFileName)

{
  byte bVar1;
  Extra_MmFlex_t *p;
  uint (*uTruthsIn) [2];
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  FILE *__stream_00;
  Mio_Library_t *pMVar6;
  Map_Super_t *pGate;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  char cVar10;
  uint nItemsCur;
  long lVar11;
  byte *__s;
  byte *pbVar12;
  double dVar13;
  int nGatesTotal;
  uint uTruthRes [2];
  char Buffer [1000];
  char pBuffer [5000];
  uint local_17cc;
  ProgressBar *local_17c8;
  uint local_17c0;
  uint local_17bc;
  uint (*local_17b8) [2];
  uint local_17b0 [2];
  char local_17a8 [1008];
  byte local_13b8 [5000];
  
  if (pLib->pGenlib != (Mio_Library_t *)0x0) {
    __assert_fail("pLib->pGenlib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x37,"int Map_LibraryRead(Map_SuperLib_t *, char *)");
  }
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return 0;
  }
  pcVar4 = fgets((char *)local_13b8,2000,__stream);
  pbVar12 = local_13b8;
  if (pcVar4 == (char *)0x0) {
    __s = (byte *)0x0;
  }
  else {
    while (__s = pbVar12, uVar5 = (ulong)*__s, uVar5 < 0x24) {
      if ((0x100002400U >> (uVar5 & 0x3f) & 1) == 0) {
        if (((0x800000001U >> (uVar5 & 0x3f) & 1) == 0) ||
           (pcVar4 = fgets((char *)local_13b8,2000,__stream), pbVar12 = local_13b8,
           pcVar4 == (char *)0x0)) break;
      }
      else {
        pbVar12 = __s + 1;
      }
    }
  }
  pcVar4 = strtok((char *)__s," \t\r\n");
  iVar2 = strcmp(pcVar4,"GATE");
  if (iVar2 == 0) {
    pcVar4 = pLib->pName;
    pcVar8 = "The input file \"%s\" looks like a genlib file and not a supergate library file.\n";
  }
  else {
    __stream_00 = fopen(pcVar4,"r");
    if (__stream_00 == (FILE *)0x0) {
      pcVar8 = "Cannot open the genlib file \"%s\".\n";
    }
    else {
      fclose(__stream_00);
      pMVar6 = Mio_LibraryRead(pcVar4,(char *)0x0,(char *)0x0,0);
      pLib->pGenlib = pMVar6;
      if (pMVar6 != (Mio_Library_t *)0x0) {
        __isoc99_fscanf(__stream,"%d\n",&pLib->nVarsMax);
        if (pLib->nVarsMax - 0xbU < 0xfffffff7) {
          pcVar4 = "Suspicious number of variables (%d).\n";
        }
        else {
          nItemsCur = 0;
          __isoc99_fscanf(__stream,"%d\n",&local_17cc);
          if (0xff67697f < local_17cc - 0x989681) {
            local_17c8 = Extra_ProgressBarStart(_stdout,local_17cc);
            pcVar4 = fgets((char *)local_13b8,5000,__stream);
            if (pcVar4 != (char *)0x0) {
              local_17b8 = pLib->uTruths;
              nItemsCur = 0;
              do {
                pbVar12 = local_13b8;
                while( true ) {
                  while (bVar1 = *pbVar12, bVar1 < 0xd) {
                    if (bVar1 != 0) {
                      if (bVar1 == 10) goto LAB_004000a2;
                      goto LAB_004000cb;
                    }
                    pcVar4 = fgets((char *)local_13b8,5000,__stream);
                    pbVar12 = local_13b8;
                    if (pcVar4 == (char *)0x0) goto LAB_0040036d;
                  }
                  if ((bVar1 != 0x20) && (bVar1 != 0xd)) break;
LAB_004000a2:
                  pbVar12 = pbVar12 + 1;
                }
LAB_004000cb:
                uVar9 = pLib->nVarsMax;
                pGate = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib->mmSupers);
                memset(pGate,0,0x100);
                pcVar4 = strtok((char *)pbVar12," ");
                iVar2 = atoi(pcVar4);
                pGate->Num = iVar2;
                pcVar4 = strtok((char *)0x0," ");
                if (pLib->nVarsMax < 6) {
                  uVar3 = Extra_ReadBinary(pcVar4);
                  pGate->uTruth[0] = uVar3;
                  uVar3 = 0;
                }
                else {
                  uVar3 = Extra_ReadBinary(pcVar4 + 0x20);
                  pGate->uTruth[0] = uVar3;
                  pcVar4[0x20] = '\0';
                  uVar3 = Extra_ReadBinary(pcVar4);
                }
                pGate->uTruth[1] = uVar3;
                pcVar4 = strtok((char *)0x0," ");
                dVar13 = atof(pcVar4);
                (pGate->tDelayMax).Rise = (float)dVar13;
                (pGate->tDelayMax).Fall = (float)dVar13;
                if (0 < (int)uVar9) {
                  lVar11 = 0;
                  do {
                    pcVar4 = strtok((char *)0x0," ");
                    dVar13 = atof(pcVar4);
                    *(float *)((long)&pGate->tDelaysR[0].Rise + lVar11) = (float)dVar13;
                    *(float *)((long)&pGate->tDelaysF[0].Fall + lVar11) = (float)dVar13;
                    lVar11 = lVar11 + 0xc;
                  } while ((ulong)uVar9 * 0xc != lVar11);
                }
                pcVar4 = strtok((char *)0x0," ");
                dVar13 = atof(pcVar4);
                pGate->Area = (float)dVar13;
                pcVar4 = strtok((char *)0x0," \r\n");
                if (*pcVar4 == '\0') {
                  puts("A gate name is empty.");
                }
                p = pLib->mmForms;
                sVar7 = strlen(pcVar4);
                pcVar8 = Extra_MmFlexEntryFetch(p,(int)sVar7 + 1);
                pGate->pFormula = pcVar8;
                strcpy(pcVar8,pcVar4);
                pcVar4 = strtok((char *)0x0," \n");
                if (pcVar4 != (char *)0x0) {
                  printf("The following trailing symbols found \"%s\".\n",pcVar4);
                }
                uTruthsIn = local_17b8;
                nItemsCur = nItemsCur + 1;
                if (pGate->Num != nItemsCur) {
                  __assert_fail("pGate->Num == nCounter + 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x97,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                pcVar4 = pGate->pFormula;
                cVar10 = *pcVar4;
                if (cVar10 != '\0') {
                  uVar9 = *(uint *)&pGate->field_0x4;
                  do {
                    pcVar4 = pcVar4 + 1;
                    uVar9 = uVar9 & 0xffffff1f | (uint)(cVar10 == '(') * 0x20 + uVar9 & 0xe0;
                    *(uint *)&pGate->field_0x4 = uVar9;
                    cVar10 = *pcVar4;
                  } while (cVar10 != '\0');
                }
                strcpy(local_17a8,pGate->pFormula);
                Map_LibraryComputeTruth_rec(pLib,local_17a8,uTruthsIn,&local_17c0);
                if ((local_17c0 != pGate->uTruth[0]) || (local_17bc != pGate->uTruth[1])) {
                  __assert_fail("Map_LibraryTruthVerify(pLib, pGate)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x9c,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                iVar2 = Map_CanonComputeSlow
                                  (uTruthsIn,pLib->nVarsMax,pLib->nVarsMax,pGate->uTruth,
                                   pGate->uPhases,local_17b0);
                *(uint *)&pGate->field_0x4 = *(uint *)&pGate->field_0x4 & 0xfffffff | iVar2 << 0x1c;
                Map_SuperTableInsertC(pLib->tTableC,local_17b0,pGate);
                if ((local_17c8 == (ProgressBar *)0x0) || (local_17c8->nItemsNext <= (int)nItemsCur)
                   ) {
                  Extra_ProgressBarUpdate_int(local_17c8,nItemsCur,(char *)0x0);
                }
                pcVar4 = fgets((char *)local_13b8,5000,__stream);
              } while (pcVar4 != (char *)0x0);
            }
LAB_0040036d:
            Extra_ProgressBarStop(local_17c8);
            pLib->nSupersAll = nItemsCur;
            iVar2 = 1;
            if (nItemsCur != local_17cc) {
              printf("The number of gates read (%d) is different what the file says (%d).\n",
                     (ulong)local_17cc,(ulong)nItemsCur);
            }
            goto LAB_003fffdf;
          }
          pcVar4 = "Suspicious number of gates (%d).\n";
        }
        iVar2 = 0;
        printf(pcVar4);
        goto LAB_003fffdf;
      }
      pcVar8 = "Cannot read genlib file \"%s\".\n";
    }
  }
  iVar2 = 0;
  printf(pcVar8,pcVar4);
LAB_003fffdf:
  fclose(__stream);
  return iVar2;
}

Assistant:

int Map_LibraryRead( Map_SuperLib_t * pLib, char * pFileName )
{
    FILE * pFile;
    int Status;
    // read the beginning of the file
    assert( pLib->pGenlib == NULL );
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return 0;
    }
    Status = Map_LibraryReadFile( pLib, pFile );
    fclose( pFile );
//    Map_LibraryPrintClasses( pLib );
    return Status;
}